

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeRepresentation::~IfcShapeRepresentation
          (IfcShapeRepresentation *this)

{
  IfcRepresentation::~IfcRepresentation
            ((IfcRepresentation *)this,&PTR_construction_vtable_24__007ed550);
  return;
}

Assistant:

IfcShapeRepresentation() : Object("IfcShapeRepresentation") {}